

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtConvexTriangleCallback::setTimeStepAndCounters
          (cbtConvexTriangleCallback *this,cbtScalar collisionMarginTriangle,
          cbtDispatcherInfo *dispatchInfo,cbtCollisionObjectWrapper *convexBodyWrap,
          cbtCollisionObjectWrapper *triBodyWrap,cbtManifoldResult *resultOut)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  float fVar8;
  cbtScalar cVar9;
  cbtTransform *pcVar10;
  cbtCollisionShape *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uint local_98;
  float local_94;
  uint local_90;
  uint local_88;
  uint local_84;
  uint uStack_80;
  uint local_78;
  uint uStack_74;
  uint local_70;
  float local_68;
  float local_64;
  float local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined1 local_28 [16];
  
  this->m_convexBodyWrap = convexBodyWrap;
  this->m_triBodyWrap = triBodyWrap;
  this->m_dispatchInfoPtr = dispatchInfo;
  this->m_collisionMarginTriangle = collisionMarginTriangle;
  this->m_resultOut = resultOut;
  cbtTransform::inverse(triBodyWrap->m_worldTransform);
  pcVar10 = this->m_convexBodyWrap->m_worldTransform;
  fVar1 = (pcVar10->m_basis).m_el[1].m_floats[0];
  cVar2 = (pcVar10->m_basis).m_el[0].m_floats[0];
  cVar3 = (pcVar10->m_basis).m_el[0].m_floats[1];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * local_94)),ZEXT416((uint)cVar2),ZEXT416(local_98)
                           );
  cVar4 = (pcVar10->m_basis).m_el[2].m_floats[0];
  auVar12 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar4),ZEXT416(local_90));
  fVar5 = (pcVar10->m_basis).m_el[1].m_floats[1];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_94)),ZEXT416((uint)cVar3),ZEXT416(local_98)
                           );
  cVar6 = (pcVar10->m_basis).m_el[2].m_floats[1];
  auVar13 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar6),ZEXT416(local_90));
  cVar7 = (pcVar10->m_basis).m_el[0].m_floats[2];
  fVar8 = (pcVar10->m_basis).m_el[1].m_floats[2];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_94)),ZEXT416((uint)cVar7),ZEXT416(local_98)
                           );
  cVar9 = (pcVar10->m_basis).m_el[2].m_floats[2];
  auVar14 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar9),ZEXT416(local_90));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(local_84));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar2),ZEXT416(local_88));
  auVar19 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar4),ZEXT416(uStack_80));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(local_84));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar3),ZEXT416(local_88));
  auVar20 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar6),ZEXT416(uStack_80));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(local_84));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar7),ZEXT416(local_88));
  auVar21 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar9),ZEXT416(uStack_80));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416(uStack_74));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416(local_78),ZEXT416((uint)cVar2));
  auVar15 = vfmadd231ss_fma(auVar18,ZEXT416(local_70),ZEXT416((uint)cVar4));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(uStack_74));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416(local_78),ZEXT416((uint)cVar3));
  auVar16 = vfmadd231ss_fma(auVar18,ZEXT416(local_70),ZEXT416((uint)cVar6));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uStack_74));
  auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416(local_78),ZEXT416((uint)cVar7));
  auVar17 = vfmadd231ss_fma(auVar18,ZEXT416(local_70),ZEXT416((uint)cVar9));
  cVar2 = (pcVar10->m_origin).m_floats[0];
  fVar1 = (pcVar10->m_origin).m_floats[1];
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * local_94)),ZEXT416((uint)cVar2),ZEXT416(local_98)
                           );
  cVar3 = (pcVar10->m_origin).m_floats[2];
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar3),ZEXT416(local_90));
  auVar22 = vmulss_avx512f(ZEXT416(local_84),ZEXT416((uint)fVar1));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar2),ZEXT416(local_88));
  auVar23 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)cVar3),ZEXT416(uStack_80));
  auVar22 = vmulss_avx512f(ZEXT416(uStack_74),ZEXT416((uint)fVar1));
  auVar22 = vfmadd231ss_avx512f(auVar22,ZEXT416((uint)cVar2),ZEXT416(local_78));
  auVar22 = vfmadd231ss_fma(auVar22,ZEXT416((uint)cVar3),ZEXT416(local_70));
  auVar18 = vinsertps_avx(ZEXT416((uint)(auVar18._0_4_ + local_68)),
                          ZEXT416((uint)(auVar23._0_4_ + local_64)),0x10);
  local_28 = vinsertps_avx(auVar18,ZEXT416((uint)(auVar22._0_4_ + local_60)),0x28);
  local_58 = auVar12._0_4_;
  local_54 = auVar13._0_4_;
  local_50 = auVar14._0_4_;
  local_4c = 0;
  local_48 = auVar19._0_4_;
  local_44 = auVar20._0_4_;
  local_40 = auVar21._0_4_;
  local_3c = 0;
  local_38 = auVar15._0_4_;
  local_34 = auVar16._0_4_;
  local_30 = auVar17._0_4_;
  local_2c = 0;
  pcVar11 = this->m_convexBodyWrap->m_shape;
  (*pcVar11->_vptr_cbtCollisionShape[2])(pcVar11,&local_58,&this->m_aabbMin,&this->m_aabbMax);
  fVar5 = collisionMarginTriangle + resultOut->m_closestPointDistanceThreshold;
  (this->m_aabbMax).m_floats[0] = fVar5 + (this->m_aabbMax).m_floats[0];
  (this->m_aabbMax).m_floats[1] = fVar5 + (this->m_aabbMax).m_floats[1];
  (this->m_aabbMax).m_floats[2] = fVar5 + (this->m_aabbMax).m_floats[2];
  fVar1 = (this->m_aabbMin).m_floats[1];
  (this->m_aabbMin).m_floats[0] = (this->m_aabbMin).m_floats[0] - fVar5;
  (this->m_aabbMin).m_floats[1] = fVar1 - fVar5;
  (this->m_aabbMin).m_floats[2] = (this->m_aabbMin).m_floats[2] - fVar5;
  return;
}

Assistant:

void cbtConvexTriangleCallback::setTimeStepAndCounters(cbtScalar collisionMarginTriangle, const cbtDispatcherInfo& dispatchInfo, const cbtCollisionObjectWrapper* convexBodyWrap, const cbtCollisionObjectWrapper* triBodyWrap, cbtManifoldResult* resultOut)
{
	m_convexBodyWrap = convexBodyWrap;
	m_triBodyWrap = triBodyWrap;

	m_dispatchInfoPtr = &dispatchInfo;
	m_collisionMarginTriangle = collisionMarginTriangle;
	m_resultOut = resultOut;

	//recalc aabbs
	cbtTransform convexInTriangleSpace;
	convexInTriangleSpace = m_triBodyWrap->getWorldTransform().inverse() * m_convexBodyWrap->getWorldTransform();
	const cbtCollisionShape* convexShape = static_cast<const cbtCollisionShape*>(m_convexBodyWrap->getCollisionShape());
	//CollisionShape* triangleShape = static_cast<cbtCollisionShape*>(triBody->m_collisionShape);
	convexShape->getAabb(convexInTriangleSpace, m_aabbMin, m_aabbMax);
	cbtScalar extraMargin = collisionMarginTriangle + resultOut->m_closestPointDistanceThreshold;

	cbtVector3 extra(extraMargin, extraMargin, extraMargin);

	m_aabbMax += extra;
	m_aabbMin -= extra;
}